

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O3

void create_binary_instruction
               (Proc *proc,opcode targetop,Pseudo *operand1,Pseudo *operand2,Pseudo *target,
               uint line_number)

{
  C_MemoryAllocator *pCVar1;
  undefined1 *ptr;
  Pseudo *pseudo;
  Pseudo *pseudo_00;
  
  pCVar1 = proc->linearizer->compiler_state->allocator;
  ptr = (undefined1 *)(*pCVar1->calloc)(pCVar1->arena,1,0x28);
  *ptr = (char)targetop;
  *(uint *)(ptr + 0x20) = line_number;
  if (((undefined1  [48])*operand1 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
    operand1 = indexed_load(proc,operand1);
    pseudo_00 = operand1;
  }
  else {
    pseudo_00 = (Pseudo *)0x0;
  }
  raviX_ptrlist_add((PtrList **)(ptr + 8),operand1,proc->linearizer->compiler_state->allocator);
  if (((undefined1  [48])*operand2 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
    pseudo = indexed_load(proc,operand2);
    operand2 = pseudo;
  }
  else {
    pseudo = (Pseudo *)0x0;
  }
  raviX_ptrlist_add((PtrList **)(ptr + 8),operand2,proc->linearizer->compiler_state->allocator);
  if (((undefined1  [48])*target & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
    __assert_fail("pseudo->type != PSEUDO_INDEXED",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                  ,0x193,"void add_instruction_target(Proc *, Instruction *, Pseudo *)");
  }
  raviX_ptrlist_add((PtrList **)(ptr + 0x10),target,proc->linearizer->compiler_state->allocator);
  if (*(BasicBlock **)(ptr + 0x18) != proc->current_bb &&
      *(BasicBlock **)(ptr + 0x18) != (BasicBlock *)0x0) {
    __assert_fail("insn->block == NULL || insn->block == proc->current_bb",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                  ,0x1b1,"void add_instruction(Proc *, Instruction *)");
  }
  raviX_ptrlist_add((PtrList **)&proc->current_bb->insns,ptr,
                    proc->linearizer->compiler_state->allocator);
  *(BasicBlock **)(ptr + 0x18) = proc->current_bb;
  if (pseudo_00 != (Pseudo *)0x0) {
    free_temp_pseudo(proc,pseudo_00,false);
  }
  if (pseudo != (Pseudo *)0x0) {
    free_temp_pseudo(proc,pseudo,false);
    return;
  }
  return;
}

Assistant:

static void create_binary_instruction(Proc *proc, enum opcode targetop, Pseudo *operand1,
				      Pseudo *operand2, Pseudo *target, unsigned line_number)
{
	Instruction *insn = allocate_instruction(proc, targetop, line_number);
	Pseudo *tofree1 = add_instruction_operand(proc, insn, operand1);
	Pseudo *tofree2 = add_instruction_operand(proc, insn, operand2);
	add_instruction_target(proc, insn, target);
	add_instruction(proc, insn);
	if (tofree1)
		free_temp_pseudo(proc, tofree1, false);
	if (tofree2)
		free_temp_pseudo(proc, tofree2, false);
}